

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::bin_int(spec *param_1)

{
  character_either *in_RDI;
  anon_class_1_0_00000001 digit01;
  char_type c;
  character_either *this;
  character_either *in_stack_ffffffffffffff00;
  character_either *in_stack_ffffffffffffff08;
  character_either *in_stack_ffffffffffffff10;
  literal *in_stack_ffffffffffffff18;
  sequence *in_stack_ffffffffffffff20;
  
  this = in_RDI;
  literal::literal<3ul>((literal *)in_RDI,(char (*) [3])in_RDI);
  c = (char_type)((ulong)in_RDI >> 0x38);
  bin_int::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)in_stack_ffffffffffffff08)
  ;
  bin_int::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)in_stack_ffffffffffffff08)
  ;
  character::character((character *)this,c);
  bin_int::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)in_stack_ffffffffffffff08)
  ;
  sequence::sequence<toml::detail::character,toml::detail::character_either>
            ((sequence *)in_stack_ffffffffffffff10,(character *)in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00);
  either::either<toml::detail::character_either,toml::detail::sequence>
            ((either *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (sequence *)in_stack_ffffffffffffff00);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
             (either *)in_stack_ffffffffffffff00);
  sequence::
  sequence<toml::detail::literal,toml::detail::character_either,toml::detail::repeat_at_least>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (repeat_at_least *)in_stack_ffffffffffffff08);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  either::~either((either *)this);
  sequence::~sequence((sequence *)this);
  character_either::~character_either(this);
  character::~character((character *)0x69a092);
  character_either::~character_either(this);
  character_either::~character_either(this);
  literal::~literal((literal *)0x69a0b6);
  return (sequence *)this;
}

Assistant:

TOML11_INLINE sequence bin_int(const spec&)
{
    const auto digit01 = []() {
        return character_either{char_type('0'), char_type('1')};
    };
    return sequence(
            literal("0b"),
            digit01(),
            repeat_at_least(0,
                either(
                    digit01(),
                    sequence(character(char_type('_')), digit01())
                )
            )
        );
}